

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O0

SmallString<32U> * __thiscall
llvm::MD5::MD5Result::digest(SmallString<32U> *__return_storage_ptr__,MD5Result *this)

{
  const_reference Vals;
  format_object<unsigned_char> local_70;
  int local_54;
  undefined1 local_50 [4];
  int i;
  raw_svector_ostream Res;
  MD5Result *this_local;
  SmallString<32U> *Str;
  
  Res.OS._7_1_ = 0;
  SmallString<32U>::SmallString(__return_storage_ptr__);
  raw_svector_ostream::raw_svector_ostream
            ((raw_svector_ostream *)local_50,(SmallVectorImpl<char> *)__return_storage_ptr__);
  for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
    Vals = std::array<unsigned_char,_16UL>::operator[](&this->Bytes,(long)local_54);
    format<unsigned_char>(&local_70,"%.2x",Vals);
    raw_ostream::operator<<((raw_ostream *)local_50,&local_70.super_format_object_base);
  }
  Res.OS._7_1_ = 1;
  raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_50);
  if ((Res.OS._7_1_ & 1) == 0) {
    SmallString<32U>::~SmallString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallString<32> MD5::MD5Result::digest() const {
  SmallString<32> Str;
  raw_svector_ostream Res(Str);
  for (int i = 0; i < 16; ++i)
    Res << format("%.2x", Bytes[i]);
  return Str;
}